

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_lha.c
# Opt level: O0

wchar_t lzh_decode_init(lzh_stream *strm,char *method)

{
  undefined4 *puVar1;
  int iVar2;
  wchar_t wVar3;
  void *pvVar4;
  undefined4 uVar5;
  char *in_RSI;
  long in_RDI;
  wchar_t w_size;
  wchar_t w_bits;
  lzh_dec *ds;
  wchar_t in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 uVar6;
  int iVar7;
  int iVar8;
  wchar_t local_4;
  
  if (*(long *)(in_RDI + 0x30) == 0) {
    pvVar4 = calloc(1,0x158);
    *(void **)(in_RDI + 0x30) = pvVar4;
    if (*(long *)(in_RDI + 0x30) == 0) {
      return L'\xffffffe2';
    }
  }
  puVar1 = *(undefined4 **)(in_RDI + 0x30);
  puVar1[0x55] = 0xffffffe7;
  if (((in_RSI == (char *)0x0) || (*in_RSI != 'l')) || (in_RSI[1] != 'h')) {
    local_4 = L'\xffffffe7';
  }
  else {
    iVar2 = (int)in_RSI[2];
    if (iVar2 == 0x35) {
      iVar8 = 0xd;
    }
    else if (iVar2 == 0x36) {
      iVar8 = 0xf;
    }
    else {
      if (iVar2 != 0x37) {
        return L'\xffffffe7';
      }
      iVar8 = 0x10;
    }
    puVar1[0x55] = 0xffffffe2;
    iVar7 = puVar1[1];
    puVar1[1] = 1 << (sbyte)iVar8;
    puVar1[2] = puVar1[1] + -1;
    if ((*(long *)(puVar1 + 4) == 0) || (iVar7 != puVar1[1])) {
      free(*(void **)(puVar1 + 4));
      pvVar4 = malloc((long)(int)puVar1[1]);
      *(void **)(puVar1 + 4) = pvVar4;
      if (*(long *)(puVar1 + 4) == 0) {
        return L'\xffffffe2';
      }
    }
    memset(*(void **)(puVar1 + 4),0x20,(long)(int)puVar1[1]);
    puVar1[6] = 0;
    puVar1[9] = 0;
    *puVar1 = 0;
    puVar1[0x4f] = iVar8 + 1;
    uVar6 = CONCAT13(1,(int3)in_stack_ffffffffffffffd0);
    if (iVar8 != 0xf) {
      uVar6 = CONCAT13(iVar8 == 0x10,(int3)in_stack_ffffffffffffffd0);
    }
    uVar5 = 4;
    if ((char)((uint)uVar6 >> 0x18) != '\0') {
      uVar5 = 5;
    }
    puVar1[0x50] = uVar5;
    puVar1[0x51] = 0x13;
    puVar1[0x52] = 5;
    *(undefined8 *)(puVar1 + 10) = 0;
    puVar1[0xc] = 0;
    wVar3 = lzh_huffman_init((huffman_conflict *)CONCAT44(iVar8,iVar7),CONCAT44(iVar2,uVar6),
                             in_stack_ffffffffffffffcc);
    if (wVar3 == L'\0') {
      puVar1[0x10] = 9;
      wVar3 = lzh_huffman_init((huffman_conflict *)CONCAT44(iVar8,iVar7),CONCAT44(iVar2,uVar6),
                               in_stack_ffffffffffffffcc);
      if (wVar3 == L'\0') {
        puVar1[0x55] = 0;
        local_4 = L'\0';
      }
      else {
        local_4 = L'\xffffffe2';
      }
    }
    else {
      local_4 = L'\xffffffe2';
    }
  }
  return local_4;
}

Assistant:

static int
lzh_decode_init(struct lzh_stream *strm, const char *method)
{
	struct lzh_dec *ds;
	int w_bits, w_size;

	if (strm->ds == NULL) {
		strm->ds = calloc(1, sizeof(*strm->ds));
		if (strm->ds == NULL)
			return (ARCHIVE_FATAL);
	}
	ds = strm->ds;
	ds->error = ARCHIVE_FAILED;
	if (method == NULL || method[0] != 'l' || method[1] != 'h')
		return (ARCHIVE_FAILED);
	switch (method[2]) {
	case '5':
		w_bits = 13;/* 8KiB for window */
		break;
	case '6':
		w_bits = 15;/* 32KiB for window */
		break;
	case '7':
		w_bits = 16;/* 64KiB for window */
		break;
	default:
		return (ARCHIVE_FAILED);/* Not supported. */
	}
	ds->error = ARCHIVE_FATAL;
	w_size = ds->w_size;
	ds->w_size = 1U << w_bits;
	ds->w_mask = ds->w_size -1;
	if (ds->w_buff == NULL || w_size != ds->w_size) {
		free(ds->w_buff);
		ds->w_buff = malloc(ds->w_size);
		if (ds->w_buff == NULL)
			return (ARCHIVE_FATAL);
	}
	memset(ds->w_buff, 0x20, ds->w_size);
	ds->w_pos = 0;
	ds->w_remaining = 0;
	ds->state = 0;
	ds->pos_pt_len_size = w_bits + 1;
	ds->pos_pt_len_bits = (w_bits == 15 || w_bits == 16)? 5: 4;
	ds->literal_pt_len_size = PT_BITLEN_SIZE;
	ds->literal_pt_len_bits = 5;
	ds->br.cache_buffer = 0;
	ds->br.cache_avail = 0;

	if (lzh_huffman_init(&(ds->lt), LT_BITLEN_SIZE, 16)
	    != ARCHIVE_OK)
		return (ARCHIVE_FATAL);
	ds->lt.len_bits = 9;
	if (lzh_huffman_init(&(ds->pt), PT_BITLEN_SIZE, 16)
	    != ARCHIVE_OK)
		return (ARCHIVE_FATAL);
	ds->error = 0;

	return (ARCHIVE_OK);
}